

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::XThreadPaf::destroy(XThreadPaf *this)

{
  Executor *pEVar1;
  MutexGuarded<kj::Executor::Impl::State> *pMVar2;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_40;
  XThreadPaf *local_30;
  XThreadPaf *local_28;
  undefined1 local_1d;
  undefined4 local_1c;
  Type local_18;
  Type local_14;
  XThreadPaf *pXStack_10;
  Type oldState;
  XThreadPaf *this_local;
  
  local_14 = 0;
  local_18 = this->state;
  pXStack_10 = this;
  if (local_18 == DISPATCHED) {
    if (this != (XThreadPaf *)0x0) {
      (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])();
    }
  }
  else {
    local_1c = 4;
    LOCK();
    local_14 = this->state;
    local_1d = local_14 == WAITING;
    if ((bool)local_1d) {
      this->state = CANCELED;
      local_14 = WAITING;
    }
    UNLOCK();
    if (!(bool)local_1d) {
      pEVar1 = Own<const_kj::Executor,_std::nullptr_t>::operator->(&this->executor);
      pMVar2 = &Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar1->impl)->state;
      local_30 = this;
      local_28 = this;
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe();
      MutexGuarded<kj::Executor::Impl::State>::
      when<kj::_::XThreadPaf::destroy()::__0,kj::_::XThreadPaf::destroy()::__1>
                (pMVar2,&local_28,&local_30,&local_40);
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_40);
      if (this != (XThreadPaf *)0x0) {
        (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])();
      }
    }
  }
  return;
}

Assistant:

void XThreadPaf::destroy() {
  auto oldState = WAITING;

  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) == DISPATCHED) {
    // Common case: Promise was fully fulfilled and dispatched, no need for locking.
    delete this;
  } else if (__atomic_compare_exchange_n(&state, &oldState, CANCELED, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // State transitioned from WAITING to CANCELED, so now it's the fulfiller's job to destroy the
    // object.
  } else {
    // Whoops, another thread is already in the process of fulfilling this promise. We'll have to
    // wait for it to finish and transition the state to FULFILLED.
    executor->impl->state.when([&](auto&) {
      return state == FULFILLED || state == DISPATCHED;
    }, [&](Executor::Impl::State& exState) {
      if (state == FULFILLED) {
        // The object is on the queue but was not yet dispatched. Remove it.
        exState.fulfilled.remove(*this);
      }
    });

    // It's ours now, delete it.
    delete this;
  }
}